

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

bool __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckSolution(SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ArrayRef<double> *x,ValueMapDbl *duals,ArrayRef<double> *obj,void *p_extra)

{
  CStringRef msg;
  CStringRef msg_00;
  bool bVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  undefined1 *puVar5;
  Error *this_00;
  Env *this_01;
  undefined8 uVar6;
  long in_RDI;
  long in_R8;
  Error *err;
  exception *exc;
  size_type i;
  string warn;
  ArrayRef<double> x1;
  vector<double,_std::allocator<double>_> x_back;
  string err_msg;
  string msgidea;
  string msgreal;
  bool fKnownInfeas;
  ArrayRef<double> *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  ArrayRef<double> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  int iVar7;
  Error *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  char *in_stack_fffffffffffffb88;
  undefined1 replace;
  string *in_stack_fffffffffffffb90;
  ArrayRef<double> *in_stack_fffffffffffffb98;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffba0;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  undefined1 local_391;
  string local_368 [32];
  string local_348 [48];
  string local_318 [39];
  undefined1 local_2f1 [40];
  undefined1 local_2c9;
  long local_2a0;
  undefined1 local_291 [113];
  undefined1 local_220 [72];
  pointer local_1d8;
  pointer pdStack_1d0;
  vector<bool,_std::allocator<bool>_> *is_final;
  ArrayRef<double> *pAVar8;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_02;
  string local_e0 [55];
  undefined1 in_stack_ffffffffffffff57;
  ArrayRef<double> *in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  pointer in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff78;
  string local_78 [8];
  pointer in_stack_ffffffffffffff90;
  string local_58 [39];
  undefined1 local_31;
  byte local_1;
  
  local_31 = in_R8 != 0;
  if (((bool)local_31) &&
     (bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::sol_check_infeas((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                  *)(in_RDI + -0x250)), !bVar1)) {
    local_1 = 1;
    goto LAB_0015e458;
  }
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68);
  mp::ArrayRef::operator_cast_to_vector(in_stack_fffffffffffffb58);
  uVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::sol_check_mode((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)(in_RDI + -0x250));
  if ((uVar2 & 0x1f) != 0) {
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    in_stack_fffffffffffffb18 = (ArrayRef<double> *)(local_e0 + 0x30);
    in_stack_fffffffffffffb20 = 0;
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_
              (in_stack_ffffffffffffff78,(ArrayRef<double> *)in_stack_ffffffffffffff70,
               (ValueMapDbl *)in_stack_ffffffffffffff68,
               (ArrayRef<double> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
               (bool)in_stack_ffffffffffffff57);
    std::__cxx11::string::operator=(local_58,local_e0);
    std::__cxx11::string::~string(local_e0);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15d7fb);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15d808);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15d815);
  }
  uVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::sol_check_mode((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)(in_RDI + -0x250));
  if ((uVar2 & 0x3e0) != 0) {
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    is_final = (vector<bool,_std::allocator<bool>_> *)0x0;
    pAVar8 = (ArrayRef<double> *)0x0;
    local_1d8 = (pointer)0x0;
    pdStack_1d0 = (pointer)0x0;
    this_02 = (SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)0x0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x15d90c);
    RecomputeAuxVars(this_02,pAVar8,is_final);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x15d940);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15d94d);
    in_stack_fffffffffffffba0 =
         (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *)local_220;
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb18);
    pAVar8 = (ArrayRef<double> *)(local_e0 + 0x30);
    ArrayRef<double>::ArrayRef
              ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               &in_stack_fffffffffffffb18->save_);
    in_stack_fffffffffffffb18 = pAVar8;
    in_stack_fffffffffffffb20 = 1;
    in_stack_fffffffffffffb98 = in_stack_fffffffffffffb18;
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::DoCheckSol_abi_cxx11_
              (in_stack_ffffffffffffff78,(ArrayRef<double> *)in_stack_ffffffffffffff70,
               (ValueMapDbl *)in_stack_ffffffffffffff68,
               (ArrayRef<double> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff90,
               (bool)in_stack_ffffffffffffff57);
    std::__cxx11::string::operator=(local_78,(string *)(local_220 + 0x28));
    std::__cxx11::string::~string((string *)(local_220 + 0x28));
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15da37);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15da44);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15da51);
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x15da5e);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    lVar3 = std::__cxx11::string::size();
    replace = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38);
    if (lVar3 != 0) goto LAB_0015db0d;
  }
  else {
LAB_0015db0d:
    in_stack_fffffffffffffb90 = (string *)local_291;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    std::allocator<char>::~allocator((allocator<char> *)local_291);
    std::__cxx11::string::operator+=((string *)(local_291 + 1),local_78);
    lVar3 = std::__cxx11::string::size();
    replace = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38);
    if (lVar3 != 0) {
      local_2a0 = std::__cxx11::string::size();
      local_2a0 = local_2a0 + -1;
      while( true ) {
        replace = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38);
        if (local_2a0 == 0) break;
        local_2a0 = local_2a0 + -1;
        in_stack_fffffffffffffb88 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        if ((*in_stack_fffffffffffffb88 == '\n') &&
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_58), *pcVar4 == ' ')) {
          puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_58);
          *puVar5 = 0x2a;
        }
      }
      local_2a0 = local_2a0 + -1;
      pcVar4 = (char *)std::__cxx11::string::front();
      if (*pcVar4 == ' ') {
        puVar5 = (undefined1 *)std::__cxx11::string::front();
        *puVar5 = 0x2a;
      }
      std::__cxx11::string::operator+=((string *)(local_291 + 1),local_58);
      std::__cxx11::string::operator+=
                ((string *)(local_291 + 1),"*: Using the solver\'s aux variable values.\n");
    }
    std::__cxx11::string::operator+=
              ((string *)(local_291 + 1),
               "Documentation: mp.ampl.com/modeling-tools.html#automatic-solution-check.");
    in_stack_fffffffffffffb77 =
         FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
         ::sol_check_fail((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(in_RDI + -0x250));
    if ((bool)in_stack_fffffffffffffb77) {
      local_2c9 = 1;
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      std::operator+((char *)this_00,in_stack_fffffffffffffb60);
      iVar7 = (int)((ulong)in_stack_fffffffffffffb60 >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)
                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      msg.data_._7_1_ = in_stack_fffffffffffffb77;
      msg.data_._0_7_ = in_stack_fffffffffffffb70;
      Error::Error(this_00,msg,iVar7);
      local_2c9 = 0;
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    in_stack_fffffffffffffb58 = (ArrayRef<double> *)(in_RDI + -0x250);
    this_01 = EnvKeeper::GetEnv((EnvKeeper *)(in_RDI + 0x20));
    in_stack_fffffffffffffb60 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         BasicSolver::GetSolCheckWarningKey(this_01,true);
    in_stack_fffffffffffffb50 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    std::__cxx11::string::string(local_318,(string *)(local_291 + 1));
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning(in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,(bool)replace);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string((string *)(local_2f1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2f1);
    std::__cxx11::string::~string((string *)(local_291 + 1));
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffb30);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    uVar2 = std::__cxx11::string::empty();
    local_1 = 0;
    if ((uVar2 & 1) != 0) {
      local_1 = std::__cxx11::string::empty();
    }
    local_1 = local_1 & 1;
  }
  else {
    std::operator+((char)((ulong)in_stack_fffffffffffffb58 >> 0x38),in_stack_fffffffffffffb50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffff68,local_348);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_368);
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::sol_check_fail((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)(in_RDI + -0x250));
    if (bVar1) {
      local_391 = 1;
      uVar6 = __cxa_allocate_exception(0x18);
      std::operator+((char *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      iVar7 = (int)((ulong)in_stack_fffffffffffffb60 >> 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)
                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb18);
      msg_00.data_._7_1_ = in_stack_fffffffffffffb77;
      msg_00.data_._0_7_ = in_stack_fffffffffffffb70;
      Error::Error(in_stack_fffffffffffffb68,msg_00,iVar7);
      local_391 = 0;
      __cxa_throw(uVar6,&Error::typeinfo,Error::~Error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58,
               (allocator<char> *)in_stack_fffffffffffffb50);
    std::__cxx11::string::string(local_3e0,(string *)&stack0xffffffffffffff68);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddWarning(in_stack_fffffffffffffba0,(string *)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb90,(bool)replace);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    local_1 = 0;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
LAB_0015e458:
  return (bool)(local_1 & 1);
}

Assistant:

bool CheckSolution(
        ArrayRef<double> x,
        const pre::ValueMapDbl& duals,   // unused
        ArrayRef<double> obj,
        void* p_extra) {
    bool fKnownInfeas = (bool)p_extra;
    if (fKnownInfeas && !MPCD( sol_check_infeas() ))
      return true;
    std::string msgreal, msgidea;
    std::string err_msg;
    try {                            // protect
      std::vector<double> x_back = x;
      if (MPCD( sol_check_mode() ) & (1+2+4+8+16)) {
        msgreal = DoCheckSol(x, duals, obj, {}, x_back, false);
      }
      if (MPCD( sol_check_mode() ) & (32+64+128+256+512)) {
        auto x1 = RecomputeAuxVars(x);
        msgidea = DoCheckSol(x1, duals, obj, x_back, x_back, true);
      }
      if (msgreal.size() || msgidea.size()) {     // Checks failed
        std::string warn
            = "Type                         MaxAbs [Name]   MaxRel [Name]\n";
        warn += msgidea;
        if (msgreal.size()) {
          for (auto i=msgreal.size()-1; i--; ) {
            if ('\n'==msgreal[i] && ' '==msgreal[i+1])
              msgreal[i+1] = '*';
          }
          if (' '==msgreal.front())
            msgreal.front() = '*';
          warn += msgreal;
          warn += "*: Using the solver's aux variable values.\n";
        }
        warn += "Documentation: mp.ampl.com/modeling-tools.html#automatic-solution-check.";
        // Should messages for realistic and idealistic
        // modes be more coordinated?
        // I.e., when no expressions.
        // What if this is an intermediate solution?
        // Should be fine - warning by default,
        // fail if requested explicitly.
        // If warning, we should add the report
        // to that solution's solve message, and
        // a summary in the final solve message.
        // For now, do this via warnings?
        if (MPCD( sol_check_fail() ))
          MP_RAISE_WITH_CODE(int(sol::MP_SOLUTION_CHECK),
                             "Solution check failed - reporting as fatal:\n"
                             + warn);
        else
          MPD( AddWarning(
                 MPD( GetEnv() ).GetSolCheckWarningKey(true),
                 warn,
                 true) );  // replace for multiple solutions
      }
    } catch (const mp::Error& err) {
      if (MPCD( sol_check_fail() ))
        throw;
      err_msg = err.what();
    } catch (const std::exception& exc) {
      err_msg = exc.what();
    } catch (...) {
      err_msg = "unknown error";
    }
    if (err_msg.size()) {
      err_msg += '\n' + msgreal + msgidea;
      if (MPCD( sol_check_fail() ))
        MP_RAISE("Solution check aborted: " + err_msg);
      MPD( AddWarning("Solution check aborted", err_msg) );
      return false;
    }
    return msgreal.empty() && msgidea.empty();
  }